

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O0

void glfwWindowHintPointer(int hint,void *value)

{
  void *pvVar1;
  void *value_local;
  int hint_local;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    pvVar1 = _glfw.hints.window.nativeParent;
  }
  else {
    pvVar1 = value;
    if (hint != 0x2000a) {
      _glfwInputError(0x10003,"Invalid window hint %i",(ulong)(uint)hint);
      pvVar1 = _glfw.hints.window.nativeParent;
    }
  }
  _glfw.hints.window.nativeParent = pvVar1;
  return;
}

Assistant:

GLFWAPI void glfwWindowHintPointer(int hint, void* value)
{
    _GLFW_REQUIRE_INIT();

    switch (hint)
    {
        case GLFW_NATIVE_PARENT_HANDLE:
	        _glfw.hints.window.nativeParent = value;
            break;
        default:
            _glfwInputError(GLFW_INVALID_ENUM, "Invalid window hint %i", hint);
            break;
    }
}